

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::ReadMessage<google::protobuf::Message>
               (CodedInputStream *input,Message *value)

{
  bool bVar1;
  pair<int,_int> pVar2;
  CodedInputStream *in_RSI;
  pair<int,_int> p;
  int length;
  Limit in_stack_0000003c;
  CodedInputStream *in_stack_00000040;
  CodedInputStream *in_stack_00000110;
  MessageLite *in_stack_00000118;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  bVar1 = io::CodedInputStream::ReadVarintSizeAsInt
                    (in_RSI,(int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (((bVar1) &&
      (pVar2 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (in_RSI,in_stack_ffffffffffffffe4), -1 < (long)pVar2)) &&
     (bVar1 = MessageLite::MergePartialFromCodedStream(in_stack_00000118,in_stack_00000110), bVar1))
  {
    bVar1 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                      (in_stack_00000040,in_stack_0000003c);
    return bVar1;
  }
  return false;
}

Assistant:

inline bool WireFormatLite::ReadMessage(io::CodedInputStream* input,
                                        MessageType* value) {
  int length;
  if (!input->ReadVarintSizeAsInt(&length)) return false;
  std::pair<io::CodedInputStream::Limit, int> p =
      input->IncrementRecursionDepthAndPushLimit(length);
  if (p.second < 0 || !value->MergePartialFromCodedStream(input)) return false;
  // Make sure that parsing stopped when the limit was hit, not at an endgroup
  // tag.
  return input->DecrementRecursionDepthAndPopLimit(p.first);
}